

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathNodeSetRemove(xmlNodeSetPtr cur,int val)

{
  int iVar1;
  xmlNodePtr ns;
  long lVar2;
  
  if ((cur != (xmlNodeSetPtr)0x0) && (val < cur->nodeNr)) {
    ns = cur->nodeTab[val];
    if ((ns != (xmlNodePtr)0x0) && (ns->type == XML_NAMESPACE_DECL)) {
      xmlXPathNodeSetFreeNs((xmlNsPtr)ns);
    }
    iVar1 = cur->nodeNr;
    cur->nodeNr = iVar1 + -1;
    if (val < iVar1 + -1) {
      lVar2 = (long)val + 1;
      do {
        cur->nodeTab[lVar2 + -1] = cur->nodeTab[lVar2];
        lVar2 = lVar2 + 1;
      } while (iVar1 != lVar2);
    }
    cur->nodeTab[(long)iVar1 + -1] = (xmlNodePtr)0x0;
  }
  return;
}

Assistant:

void
xmlXPathNodeSetRemove(xmlNodeSetPtr cur, int val) {
    if (cur == NULL) return;
    if (val >= cur->nodeNr) return;
    if ((cur->nodeTab[val] != NULL) &&
	(cur->nodeTab[val]->type == XML_NAMESPACE_DECL))
	xmlXPathNodeSetFreeNs((xmlNsPtr) cur->nodeTab[val]);
    cur->nodeNr--;
    for (;val < cur->nodeNr;val++)
        cur->nodeTab[val] = cur->nodeTab[val + 1];
    cur->nodeTab[cur->nodeNr] = NULL;
}